

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

Reference __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadReference
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  Reference RVar2;
  
  this_00 = this->reader_;
  pcVar1 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar1;
  (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
  if (*pcVar1 != 'v') {
    TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x12cf66);
  }
  RVar2 = DoReadReference(this);
  return RVar2;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }